

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  byte *pbVar1;
  u32 *puVar2;
  undefined4 p1;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Vdbe *p_00;
  Parse *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  u8 uVar10;
  LogEst LVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int p2;
  int iVar16;
  int iVar17;
  int iVar18;
  Vdbe *pVVar19;
  Select *pSVar20;
  int *zP4;
  ExprList *pEVar21;
  Expr *pEVar22;
  KeyInfo *pKVar23;
  CollSeq *pCVar24;
  Op *pOVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  anon_union_4_2_6146edf4_for_u *paVar29;
  Select *pSVar30;
  char *pcVar31;
  byte bVar32;
  int iVar33;
  int nExtra;
  ulong extraout_RDX;
  ulong uVar34;
  short sVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  Select *pSVar40;
  long in_FS_OFFSET;
  bool bVar41;
  KeyInfo *local_f8;
  SelectDest local_d8;
  undefined1 local_a8 [12];
  undefined1 *puStack_9c;
  undefined4 uStack_94;
  char *pcStack_90;
  ExprList *local_88;
  SelectDest destA;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = pParse->db;
  pSVar40 = p->pPrior;
  local_d8.pOrderBy = pDest->pOrderBy;
  local_d8.eDest = pDest->eDest;
  local_d8._1_3_ = *(undefined3 *)&pDest->field_0x1;
  local_d8.iSDParm = pDest->iSDParm;
  uVar7 = pDest->iSDParm2;
  uVar8 = pDest->iSdst;
  local_d8.zAffSdst = pDest->zAffSdst;
  local_d8.nSdst = (int)*(undefined8 *)&pDest->nSdst;
  local_d8._20_4_ = SUB84((ulong)*(undefined8 *)&pDest->nSdst >> 0x20,0);
  local_d8.iSDParm2 = uVar7;
  local_d8.iSdst = uVar8;
  pVVar19 = sqlite3GetVdbe(pParse);
  if (local_d8.eDest == '\f') {
    sqlite3VdbeAddOp3(pVVar19,0x75,local_d8.iSDParm,p->pEList->nExpr,0);
    local_d8.eDest = '\x0e';
  }
  if ((p->selFlags & 0x400) == 0) {
LAB_0018a84a:
    if ((p->selFlags & 0x2000) == 0) {
LAB_0018a8ce:
      pEVar21 = p->pOrderBy;
      if (pEVar21 != (ExprList *)0x0) {
        destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        destA.nSdst = -0x55555556;
        destA._20_4_ = 0xaaaaaaaa;
        destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        destA.iSDParm2 = -0x55555556;
        destA.iSdst = -0x55555556;
        local_88 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        uStack_94 = 0xaaaaaaaa;
        pcStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._0_4_ = 0xaaaaaaaa;
        local_a8._4_4_ = -0x55555556;
        local_a8._8_4_ = -0x55555556;
        puStack_9c = &DAT_aaaaaaaaaaaaaaaa;
        psVar3 = pParse->db;
        pVVar19 = pParse->pVdbe;
        iVar18 = pParse->nLabel;
        iVar26 = iVar18 + -2;
        pParse->nLabel = iVar26;
        uVar10 = p->op;
        iVar16 = pEVar21->nExpr;
        if ((uVar10 != 0x88) && (psVar3->mallocFailed == '\0')) {
          uVar12 = 1;
          do {
            if (p->pEList->nExpr < (int)uVar12) break;
            if (iVar16 < 1) {
              iVar15 = 0;
            }
            else {
              paVar29 = &pEVar21->a[0].u;
              iVar33 = 0;
              do {
                iVar15 = iVar33;
                if (uVar12 == (paVar29->x).iOrderByCol) break;
                iVar33 = iVar33 + 1;
                paVar29 = paVar29 + 6;
                iVar15 = iVar16;
              } while (iVar16 != iVar33);
            }
            bVar9 = true;
            bVar41 = bVar9;
            if (iVar15 == iVar16) {
              local_48._12_4_ = 0xaaaaaaaa;
              local_48.z = (char *)0x0;
              local_48.n = 0;
              pEVar22 = sqlite3ExprAlloc(psVar3,0x9c,&local_48,0);
              bVar41 = pEVar22 != (Expr *)0x0;
              if (bVar41) {
                pbVar1 = (byte *)((long)&pEVar22->flags + 1);
                *pbVar1 = *pbVar1 | 8;
                (pEVar22->u).iValue = uVar12;
                pEVar21 = sqlite3ExprListAppend(pParse,pEVar21,pEVar22);
                p->pOrderBy = pEVar21;
                bVar41 = bVar9;
                if (pEVar21 != (ExprList *)0x0) {
                  lVar36 = (long)iVar16;
                  iVar16 = iVar16 + 1;
                  pEVar21->a[lVar36].u.x.iOrderByCol = (u16)uVar12;
                }
              }
            }
            if (!bVar41) {
              uVar12 = 7;
              goto LAB_0018bf5b;
            }
            uVar12 = uVar12 + 1;
          } while (psVar3->mallocFailed == '\0');
        }
        zP4 = (int *)sqlite3DbMallocRawNN(psVar3,(long)iVar16 * 4 + 4);
        if (zP4 == (int *)0x0) {
          local_f8 = (KeyInfo *)0x0;
        }
        else {
          *zP4 = iVar16;
          uVar34 = extraout_RDX;
          if (0 < iVar16) {
            paVar29 = &pEVar21->a[0].u;
            uVar34 = 1;
            do {
              zP4[uVar34] = (paVar29->x).iOrderByCol - 1;
              uVar34 = uVar34 + 1;
              paVar29 = paVar29 + 6;
            } while (iVar16 + 1 != uVar34);
          }
          local_f8 = multiSelectOrderByKeyInfo(pParse,p,(int)uVar34);
        }
        if (uVar10 == 0x88) {
          iVar15 = 0;
          pKVar23 = (KeyInfo *)0x0;
        }
        else {
          uVar12 = p->pEList->nExpr;
          iVar15 = pParse->nMem + 1;
          pParse->nMem = pParse->nMem + uVar12 + 1;
          sqlite3VdbeAddOp3(pVVar19,0x47,0,iVar15,0);
          pKVar23 = sqlite3KeyInfoAlloc(psVar3,uVar12,1);
          if (0 < (int)uVar12 && pKVar23 != (KeyInfo *)0x0) {
            uVar34 = 0;
            do {
              pCVar24 = multiSelectCollSeq(pParse,p,(int)uVar34);
              pKVar23->aColl[uVar34] = pCVar24;
              pKVar23->aSortFlags[uVar34] = '\0';
              uVar34 = uVar34 + 1;
            } while (uVar12 != uVar34);
          }
        }
        bVar32 = uVar10 + 0x79;
        uVar12 = 1;
        if ((bVar32 < 2) && ((psVar3->dbOptFlags & 0x200000) == 0)) {
          pSVar20 = p->pPrior;
          pSVar40 = p;
          while ((pSVar30 = pSVar20, pSVar30 != (Select *)0x0 && (pSVar40->op == uVar10))) {
            uVar12 = uVar12 + 1;
            pSVar20 = pSVar30->pPrior;
            pSVar40 = pSVar30;
          }
        }
        iVar18 = iVar18 + -1;
        pSVar40 = p;
        if (3 < uVar12) {
          uVar27 = 2;
          do {
            pSVar40 = pSVar40->pPrior;
            uVar27 = uVar27 + 2;
          } while (uVar27 < uVar12);
        }
        pSVar20 = pSVar40->pPrior;
        pSVar40->pPrior = (Select *)0x0;
        iVar33 = 0;
        pSVar20->pNext = (Select *)0x0;
        pEVar21 = sqlite3ExprListDup(pParse->db,pEVar21,0);
        pSVar20->pOrderBy = pEVar21;
        sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
        sqlite3ResolveOrderGroupBy(pParse,pSVar20,pSVar20->pOrderBy,"ORDER");
        computeLimitRegisters(pParse,p,iVar18);
        iVar39 = p->iLimit;
        iVar17 = 0;
        if (iVar39 != 0 && uVar10 == 0x88) {
          iVar33 = pParse->nMem + 1;
          iVar17 = pParse->nMem + 2;
          pParse->nMem = iVar17;
          iVar28 = p->iOffset + 1;
          if (p->iOffset == 0) {
            iVar28 = iVar39;
          }
          sqlite3VdbeAddOp3(pVVar19,0x50,iVar28,iVar33,0);
          sqlite3VdbeAddOp3(pVVar19,0x50,iVar33,iVar17,0);
        }
        if (p->pLimit != (Expr *)0x0) {
          sqlite3ExprDeleteNN(psVar3,p->pLimit);
        }
        p->pLimit = (Expr *)0x0;
        iVar37 = pParse->nMem;
        iVar39 = iVar37 + 1;
        iVar28 = iVar37 + 2;
        iVar38 = iVar37 + 4;
        pParse->nMem = iVar38;
        destA.eDest = '\r';
        destA.iSDParm = iVar39;
        destA.iSDParm2 = 0;
        destA.zAffSdst = (char *)0x0;
        destA.iSdst = 0;
        destA.nSdst = 0;
        local_a8[0] = '\r';
        local_a8._8_4_ = 0;
        pcStack_90 = (char *)0x0;
        puStack_9c = (undefined1 *)0x0;
        iVar37 = iVar37 + 3;
        local_a8._4_4_ = iVar28;
        sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
        iVar13 = sqlite3VdbeAddOp3(pVVar19,0xb,iVar39,0,pVVar19->nOp + 1);
        pSVar20->iLimit = iVar33;
        sqlite3VdbeExplain(pParse,'\x01',"LEFT");
        sqlite3Select(pParse,pSVar20,&destA);
        sqlite3VdbeAddOp3(pVVar19,0x44,iVar39,0,0);
        pPVar5 = pVVar19->pParse;
        pPVar5->nTempReg = '\0';
        pPVar5->nRangeReg = 0;
        iVar33 = pVVar19->nOp;
        if (pVVar19->db->mallocFailed == '\0') {
          pOVar25 = pVVar19->aOp + iVar13;
        }
        else {
          pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar25->p2 = iVar33;
        iVar14 = sqlite3VdbeAddOp3(pVVar19,0xb,iVar28,0,iVar33 + 1);
        iVar33 = p->iLimit;
        iVar13 = p->iOffset;
        p->iLimit = iVar17;
        p->iOffset = 0;
        sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
        sqlite3Select(pParse,p,(SelectDest *)local_a8);
        p->iLimit = iVar33;
        p->iOffset = iVar13;
        sqlite3VdbeAddOp3(pVVar19,0x44,iVar28,0,0);
        pPVar5 = pVVar19->pParse;
        pPVar5->nTempReg = '\0';
        iVar33 = 0;
        pPVar5->nRangeReg = 0;
        iVar17 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar37,iVar15,pKVar23,iVar18);
        if (bVar32 < 2) {
          iVar33 = generateOutputSubroutine
                             (pParse,p,(SelectDest *)local_a8,pDest,iVar38,iVar15,pKVar23,iVar18);
        }
        if ((pKVar23 != (KeyInfo *)0x0) && (pKVar23->nRef = pKVar23->nRef - 1, pKVar23->nRef == 0))
        {
          sqlite3DbNNFreeNN(pKVar23->db,pKVar23);
        }
        iVar15 = iVar18;
        iVar13 = iVar18;
        if (1 < (byte)(uVar10 + 0x77)) {
          iVar13 = sqlite3VdbeAddOp3(pVVar19,10,iVar38,iVar33,0);
          iVar15 = sqlite3VdbeAddOp3(pVVar19,0xc,iVar28,iVar18,0);
          sqlite3VdbeAddOp3(pVVar19,9,0,iVar13,0);
          LVar11 = sqlite3LogEstAdd(p->nSelectRow,pSVar20->nSelectRow);
          p->nSelectRow = LVar11;
        }
        if (uVar10 == 0x8a) {
          p2 = iVar13;
          if (pSVar20->nSelectRow < p->nSelectRow) {
            p->nSelectRow = pSVar20->nSelectRow;
          }
        }
        else {
          p2 = sqlite3VdbeAddOp3(pVVar19,10,iVar37,iVar17,0);
          sqlite3VdbeAddOp3(pVVar19,0xc,iVar39,iVar18,0);
          sqlite3VdbeAddOp3(pVVar19,9,0,p2,0);
        }
        iVar37 = sqlite3VdbeAddOp3(pVVar19,10,iVar37,iVar17,0);
        sqlite3VdbeAddOp3(pVVar19,0xc,iVar39,iVar13,0);
        sqlite3VdbeAddOp3(pVVar19,9,0,iVar26,0);
        iVar17 = iVar37;
        if (uVar10 != 0x88) {
          if (uVar10 == 0x8a) {
            iVar37 = iVar37 + 1;
          }
          else {
            iVar17 = sqlite3VdbeAddOp3(pVVar19,0xc,iVar39,iVar13,0);
            sqlite3VdbeAddOp3(pVVar19,9,0,iVar26,0);
          }
        }
        iVar13 = pVVar19->nOp;
        if (bVar32 < 2) {
          sqlite3VdbeAddOp3(pVVar19,10,iVar38,iVar33,0);
        }
        sqlite3VdbeAddOp3(pVVar19,0xc,iVar28,p2,0);
        sqlite3VdbeAddOp3(pVVar19,9,0,iVar26,0);
        if (pVVar19->db->mallocFailed == '\0') {
          pOVar25 = pVVar19->aOp + iVar14;
        }
        else {
          pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar25->p2 = pVVar19->nOp;
        sqlite3VdbeAddOp3(pVVar19,0xc,iVar39,iVar15,0);
        sqlite3VdbeAddOp3(pVVar19,0xc,iVar28,p2,0);
        sqlite3VdbeResolveLabel(pVVar19,iVar26);
        iVar26 = sqlite3VdbeAddOp3(pVVar19,0x59,0,0,0);
        sqlite3VdbeChangeP4(pVVar19,iVar26,(char *)zP4,-0xe);
        iVar16 = sqlite3VdbeAddOp3(pVVar19,0x5a,destA.iSdst,(int)puStack_9c,iVar16);
        sqlite3VdbeChangeP4(pVVar19,iVar16,(char *)local_f8,-8);
        if (0 < (long)pVVar19->nOp) {
          pVVar19->aOp[(long)pVVar19->nOp + -1].p5 = 1;
        }
        sqlite3VdbeAddOp3(pVVar19,0xe,iVar37,iVar17,iVar13);
        sqlite3VdbeResolveLabel(pVVar19,iVar18);
        if (pSVar40->pPrior != (Select *)0x0) {
          sqlite3ParserAddCleanup(pParse,sqlite3SelectDeleteGeneric,pSVar40->pPrior);
        }
        pSVar40->pPrior = pSVar20;
        pSVar20->pNext = pSVar40;
        if (pSVar20->pOrderBy != (ExprList *)0x0) {
          exprListDeleteNN(psVar3,pSVar20->pOrderBy);
        }
        pSVar20->pOrderBy = (ExprList *)0x0;
        if ((long)pParse->addrExplain == 0) {
          iVar18 = 0;
        }
        else {
          if (pParse->pVdbe->db->mallocFailed == '\0') {
            pOVar25 = pParse->pVdbe->aOp + pParse->addrExplain;
          }
          else {
            pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          iVar18 = pOVar25->p2;
        }
        pParse->addrExplain = iVar18;
        uVar12 = (uint)(pParse->nErr != 0);
        goto LAB_0018bf5b;
      }
      if (pSVar40->pPrior == (Select *)0x0) {
        sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
        sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
      }
      uVar10 = p->op;
      if ((uVar10 == 0x87) || (uVar10 == 0x89)) {
        destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        destA.nSdst = -0x55555556;
        destA._20_4_ = 0xaaaaaaaa;
        destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        destA.iSDParm2 = -0x55555556;
        destA.iSdst = -0x55555556;
        uVar10 = local_d8.eDest;
        if (local_d8.eDest == '\x01') {
          iVar18 = local_d8.iSDParm;
        }
        else {
          iVar18 = pParse->nTab;
          pParse->nTab = iVar18 + 1;
          iVar16 = sqlite3VdbeAddOp3(pVVar19,0x75,iVar18,0,0);
          p->addrOpenEphm[0] = iVar16;
          pSVar20 = p;
          do {
            pSVar30 = pSVar20;
            pSVar20 = pSVar30->pNext;
          } while (pSVar20 != (Select *)0x0);
          puVar2 = &pSVar30->selFlags;
          *(byte *)puVar2 = (byte)*puVar2 | 0x20;
        }
        destA.eDest = '\x01';
        destA.iSDParm = iVar18;
        destA.iSDParm2 = 0;
        pSVar20 = (Select *)0x0;
        destA.zAffSdst = (char *)0x0;
        destA.iSdst = 0;
        destA.nSdst = 0;
        uVar27 = sqlite3Select(pParse,pSVar40,&destA);
        uVar12 = uVar27;
        if (uVar27 == 0) {
          p->pPrior = (Select *)0x0;
          pEVar22 = p->pLimit;
          p->pLimit = (Expr *)0x0;
          destA.eDest = (p->op == 0x89) + '\x01';
          bVar32 = p->op + 0x78;
          if (bVar32 < 3) {
            pcVar31 = (&PTR_anon_var_dwarf_7dc1c_0023f730)[bVar32];
          }
          else {
            pcVar31 = "UNION";
          }
          sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar31);
          uVar12 = sqlite3Select(pParse,p,&destA);
          pSVar20 = p->pPrior;
          p->pPrior = pSVar40;
          p->pOrderBy = (ExprList *)0x0;
          if (p->op == 0x87) {
            LVar11 = sqlite3LogEstAdd(p->nSelectRow,pSVar40->nSelectRow);
            p->nSelectRow = LVar11;
          }
          if (p->pLimit != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar3,p->pLimit);
          }
          p->pLimit = pEVar22;
          p->iLimit = 0;
          p->iOffset = 0;
          if ((uVar10 != '\x01') && (psVar3->mallocFailed == '\0')) {
            iVar16 = pParse->nLabel + -1;
            iVar15 = pParse->nLabel + -2;
            pParse->nLabel = iVar15;
            computeLimitRegisters(pParse,p,iVar16);
            sqlite3VdbeAddOp3(pVVar19,0x24,iVar18,iVar16,0);
            iVar26 = pVVar19->nOp;
            selectInnerLoop(pParse,p,iVar18,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar15,
                            iVar16);
            sqlite3VdbeResolveLabel(pVVar19,iVar15);
            sqlite3VdbeAddOp3(pVVar19,0x27,iVar18,iVar26,0);
            sqlite3VdbeResolveLabel(pVVar19,iVar16);
            sqlite3VdbeAddOp3(pVVar19,0x7a,iVar18,0,0);
          }
        }
      }
      else if (uVar10 == 0x88) {
        destA._0_8_ = (ulong)(uint)destA.iSDParm << 0x20;
        iVar18 = p->iOffset;
        pSVar40->iLimit = p->iLimit;
        pSVar40->iOffset = iVar18;
        pSVar40->pLimit = p->pLimit;
        uVar27 = sqlite3Select(pParse,pSVar40,&local_d8);
        pSVar40->pLimit = (Expr *)0x0;
        if (uVar27 == 0) {
          iVar18 = 0;
          p->pPrior = (Select *)0x0;
          p1 = pSVar40->iLimit;
          uVar6 = pSVar40->iOffset;
          p->iLimit = p1;
          p->iOffset = uVar6;
          if (p1 != 0) {
            iVar18 = sqlite3VdbeAddOp3(pVVar19,0x11,p1,0,0);
            iVar16 = p->iOffset;
            if (iVar16 != 0) {
              sqlite3VdbeAddOp3(pVVar19,0xa0,p->iLimit,iVar16 + 1,iVar16);
            }
          }
          sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
          uVar12 = sqlite3Select(pParse,p,&local_d8);
          pSVar20 = p->pPrior;
          p->pPrior = pSVar40;
          LVar11 = sqlite3LogEstAdd(p->nSelectRow,pSVar40->nSelectRow);
          p->nSelectRow = LVar11;
          if (p->pLimit != (Expr *)0x0) {
            iVar16 = sqlite3ExprIsInteger(p->pLimit->pLeft,(int *)&destA,pParse);
            if ((0 < (int)destA._0_4_ && iVar16 != 0) &&
               (sVar35 = p->nSelectRow, LVar11 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
               LVar11 < sVar35)) {
              p->nSelectRow = LVar11;
            }
          }
          if (iVar18 != 0) {
            if (pVVar19->db->mallocFailed == '\0') {
              pOVar25 = pVVar19->aOp + iVar18;
            }
            else {
              pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar25->p2 = pVVar19->nOp;
          }
        }
        else {
          pSVar20 = (Select *)0x0;
          uVar12 = uVar27;
        }
      }
      else {
        destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        destA.nSdst = -0x55555556;
        destA._20_4_ = 0xaaaaaaaa;
        destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
        destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        destA.iSDParm2 = -0x55555556;
        destA.iSdst = -0x55555556;
        iVar18 = pParse->nTab;
        pParse->nTab = iVar18 + 2;
        iVar16 = sqlite3VdbeAddOp3(pVVar19,0x75,iVar18,0,0);
        p->addrOpenEphm[0] = iVar16;
        pSVar20 = p;
        do {
          pSVar30 = pSVar20;
          pSVar20 = pSVar30->pNext;
        } while (pSVar20 != (Select *)0x0);
        puVar2 = &pSVar30->selFlags;
        *(byte *)puVar2 = (byte)*puVar2 | 0x20;
        destA.eDest = '\x01';
        destA.iSDParm = iVar18;
        destA.iSDParm2 = 0;
        pSVar20 = (Select *)0x0;
        destA.zAffSdst = (char *)0x0;
        destA.iSdst = 0;
        destA.nSdst = 0;
        uVar27 = sqlite3Select(pParse,pSVar40,&destA);
        uVar12 = uVar27;
        if (uVar27 == 0) {
          iVar16 = iVar18 + 1;
          iVar26 = sqlite3VdbeAddOp3(pVVar19,0x75,iVar16,0,0);
          p->addrOpenEphm[1] = iVar26;
          p->pPrior = (Select *)0x0;
          pEVar22 = p->pLimit;
          p->pLimit = (Expr *)0x0;
          destA.iSDParm = iVar16;
          bVar32 = p->op + 0x78;
          if (bVar32 < 3) {
            pcVar31 = (&PTR_anon_var_dwarf_7dc1c_0023f730)[bVar32];
          }
          else {
            pcVar31 = "UNION";
          }
          sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar31);
          uVar12 = sqlite3Select(pParse,p,&destA);
          pSVar20 = p->pPrior;
          p->pPrior = pSVar40;
          if (pSVar40->nSelectRow < p->nSelectRow) {
            p->nSelectRow = pSVar40->nSelectRow;
          }
          if (p->pLimit != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar3,p->pLimit);
          }
          p->pLimit = pEVar22;
          if (uVar12 == 0) {
            iVar26 = pParse->nLabel + -1;
            iVar15 = pParse->nLabel + -2;
            pParse->nLabel = iVar15;
            computeLimitRegisters(pParse,p,iVar26);
            sqlite3VdbeAddOp3(pVVar19,0x24,iVar18,iVar26,0);
            if (pParse->nTempReg == '\0') {
              iVar33 = pParse->nMem + 1;
              pParse->nMem = iVar33;
            }
            else {
              bVar32 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar32;
              iVar33 = pParse->aTempReg[bVar32];
            }
            iVar39 = sqlite3VdbeAddOp3(pVVar19,0x86,iVar18,iVar33,0);
            sqlite3VdbeAddOp4Int(pVVar19,0x1c,iVar16,iVar15,iVar33,0);
            if (iVar33 != 0) {
              bVar32 = pParse->nTempReg;
              if ((ulong)bVar32 < 8) {
                pParse->nTempReg = bVar32 + 1;
                pParse->aTempReg[bVar32] = iVar33;
              }
            }
            selectInnerLoop(pParse,p,iVar18,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar15,
                            iVar26);
            sqlite3VdbeResolveLabel(pVVar19,iVar15);
            sqlite3VdbeAddOp3(pVVar19,0x27,iVar18,iVar39,0);
            sqlite3VdbeResolveLabel(pVVar19,iVar26);
            sqlite3VdbeAddOp3(pVVar19,0x7a,iVar16,0,0);
            sqlite3VdbeAddOp3(pVVar19,0x7a,iVar18,0,0);
            uVar12 = 0;
          }
        }
      }
      if (uVar27 != 0) goto LAB_0018bf37;
      if (p->pNext == (Select *)0x0) {
        if ((long)pParse->addrExplain == 0) {
          iVar18 = 0;
        }
        else {
          if (pParse->pVdbe->db->mallocFailed == '\0') {
            pOVar25 = pParse->pVdbe->aOp + pParse->addrExplain;
          }
          else {
            pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          iVar18 = pOVar25->p2;
        }
        pParse->addrExplain = iVar18;
      }
    }
    else {
      bVar41 = p == (Select *)0x0;
      pSVar20 = p;
      if (bVar41) {
LAB_0018a870:
        if (bVar41) goto LAB_0018a8ce;
      }
      else {
        do {
          pSVar20 = pSVar20->pPrior;
          bVar41 = pSVar20 == (Select *)0x0;
          if (bVar41) goto LAB_0018a870;
        } while ((pSVar20->selFlags & 0x2000) != 0);
      }
      pSVar4 = p->pSrc;
      iVar18 = p->pEList->nExpr;
      p_00 = pParse->pVdbe;
      destA.pOrderBy = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
      destA.nSdst = -0x55555556;
      destA._20_4_ = 0xaaaaaaaa;
      destA.zAffSdst = &DAT_aaaaaaaaaaaaaaaa;
      destA._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      destA.iSDParm2 = -0x55555556;
      destA.iSdst = -0x55555556;
      if (p->pWin == (Window *)0x0) {
        iVar16 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
        if (iVar16 == 0) {
          iVar33 = pParse->nLabel + -1;
          pParse->nLabel = iVar33;
          p->nSelectRow = 0x140;
          computeLimitRegisters(pParse,p,iVar33);
          pEVar22 = p->pLimit;
          iVar16 = p->iLimit;
          iVar26 = p->iOffset;
          p->pLimit = (Expr *)0x0;
          p->iLimit = 0;
          p->iOffset = 0;
          iVar15 = 0;
          if (0 < (long)pSVar4->nSrc) {
            lVar36 = 0;
            do {
              if (((&pSVar4->a[0].fg.field_0x1)[lVar36] & 0x80) != 0) {
                iVar15 = *(int *)((long)&pSVar4->a[0].iCursor + lVar36);
                goto LAB_0018b8c9;
              }
              lVar36 = lVar36 + 0x48;
            } while ((long)pSVar4->nSrc * 0x48 != lVar36);
            iVar15 = 0;
          }
LAB_0018b8c9:
          pEVar21 = p->pOrderBy;
          iVar39 = pParse->nTab;
          iVar17 = iVar39 + 1;
          pParse->nTab = iVar17;
          if (p->op == 0x87) {
            uVar10 = '\x06' - (pEVar21 == (ExprList *)0x0);
            pParse->nTab = iVar39 + 2;
          }
          else {
            iVar17 = 0;
            uVar10 = (pEVar21 == (ExprList *)0x0) + '\a';
          }
          destA.eDest = uVar10;
          destA.iSDParm = iVar39;
          destA.iSDParm2 = 0;
          destA.zAffSdst = (char *)0x0;
          destA.iSdst = 0;
          destA.nSdst = 0;
          iVar28 = pParse->nMem + 1;
          pParse->nMem = iVar28;
          sqlite3VdbeAddOp3(p_00,0x79,iVar15,iVar28,iVar18);
          if (pEVar21 == (ExprList *)0x0) {
            sqlite3VdbeAddOp3(p_00,0x75,iVar39,iVar18,0);
          }
          else {
            pKVar23 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
            iVar18 = sqlite3VdbeAddOp3(p_00,0x75,iVar39,pEVar21->nExpr + 2,0);
            sqlite3VdbeChangeP4(p_00,iVar18,(char *)pKVar23,-8);
            destA.pOrderBy = pEVar21;
          }
          if (iVar17 != 0) {
            iVar18 = sqlite3VdbeAddOp3(p_00,0x75,iVar17,0,0);
            p->addrOpenEphm[0] = iVar18;
            *(byte *)&p->selFlags = (byte)p->selFlags | 0x20;
          }
          p->pOrderBy = (ExprList *)0x0;
          pSVar40 = p;
          do {
            pSVar20 = pSVar40;
            if (pSVar20 == (Select *)0x0) break;
            if ((pSVar20->selFlags & 8) != 0) {
              sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
              goto LAB_0018bcff;
            }
            pSVar20->op = 0x88;
            pSVar40 = pSVar20->pPrior;
          } while ((pSVar20->pPrior->selFlags & 0x2000) != 0);
          pSVar40 = pSVar20->pPrior;
          pSVar40->pNext = (Select *)0x0;
          sqlite3VdbeExplain(pParse,'\x01',"SETUP");
          iVar18 = sqlite3Select(pParse,pSVar40,&destA);
          pSVar40->pNext = p;
          if (iVar18 == 0) {
            iVar18 = sqlite3VdbeAddOp3(p_00,0x24,iVar39,iVar33,0);
            sqlite3VdbeAddOp3(p_00,0x88,iVar15,0,0);
            if (pEVar21 == (ExprList *)0x0) {
              iVar37 = 0x86;
              iVar38 = 0;
              iVar17 = iVar28;
            }
            else {
              iVar37 = 0x5e;
              iVar17 = pEVar21->nExpr + 1;
              iVar38 = iVar28;
            }
            sqlite3VdbeAddOp3(p_00,iVar37,iVar39,iVar17,iVar38);
            sqlite3VdbeAddOp3(p_00,0x82,iVar39,0,0);
            iVar39 = pParse->nLabel + -1;
            pParse->nLabel = iVar39;
            if (0 < iVar26) {
              sqlite3VdbeAddOp3(p_00,0x32,iVar26,iVar39,1);
            }
            selectInnerLoop(pParse,p,iVar15,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,iVar39,
                            iVar33);
            if (iVar16 != 0) {
              sqlite3VdbeAddOp3(p_00,0x3d,iVar16,iVar33,0);
            }
            sqlite3VdbeResolveLabel(p_00,iVar39);
            pSVar20->pPrior = (Select *)0x0;
            sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
            sqlite3Select(pParse,p,&destA);
            pSVar20->pPrior = pSVar40;
            sqlite3VdbeAddOp3(p_00,9,0,iVar18,0);
            sqlite3VdbeResolveLabel(p_00,iVar33);
          }
LAB_0018bcff:
          if (p->pOrderBy != (ExprList *)0x0) {
            exprListDeleteNN(pParse->db,p->pOrderBy);
          }
          p->pOrderBy = pEVar21;
          p->pLimit = pEVar22;
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
      }
      pSVar20 = (Select *)0x0;
      uVar12 = 0;
    }
    if ((pParse->nErr == 0) && ((p->selFlags & 0x20) != 0)) {
      iVar18 = p->pEList->nExpr;
      pKVar23 = sqlite3KeyInfoAlloc(psVar3,iVar18,1);
      if (pKVar23 == (KeyInfo *)0x0) {
        uVar12 = 7;
      }
      else {
        if (0 < iVar18) {
          lVar36 = 0;
          do {
            pCVar24 = multiSelectCollSeq(pParse,p,(int)lVar36);
            pKVar23->aColl[lVar36] = pCVar24;
            if (pCVar24 == (CollSeq *)0x0) {
              pKVar23->aColl[lVar36] = psVar3->pDfltColl;
            }
            lVar36 = lVar36 + 1;
          } while (iVar18 != (int)lVar36);
        }
        if (p != (Select *)0x0) {
          do {
            lVar36 = 0;
            do {
              iVar16 = p->addrOpenEphm[lVar36];
              if ((long)iVar16 < 0) break;
              pOVar25 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (pVVar19->db->mallocFailed == '\0') {
                pOVar25 = pVVar19->aOp + iVar16;
              }
              pOVar25->p2 = iVar18;
              pKVar23->nRef = pKVar23->nRef + 1;
              sqlite3VdbeChangeP4(pVVar19,iVar16,(char *)pKVar23,-8);
              p->addrOpenEphm[lVar36] = -1;
              lVar36 = lVar36 + 1;
            } while (lVar36 == 1);
            p = p->pPrior;
          } while (p != (Select *)0x0);
        }
        pKVar23->nRef = pKVar23->nRef - 1;
        if (pKVar23->nRef == 0) {
          sqlite3DbNNFreeNN(pKVar23->db,pKVar23);
        }
      }
    }
  }
  else {
    pEVar22 = p->pLimit;
    bVar41 = p->pWin == (Window *)0x0;
    uVar12 = 0xffffffff;
    if (bVar41) {
      if (p->pPrior == (Select *)0x0) {
        sVar35 = 1;
        pSVar20 = p;
      }
      else {
        sVar35 = 1;
        pSVar30 = p->pPrior;
        do {
          pSVar20 = pSVar30;
          bVar41 = pSVar20->pWin == (Window *)0x0;
          if (!bVar41) goto LAB_0018a83d;
          sVar35 = sVar35 + (ushort)(pEVar22 == (Expr *)0x0);
          pSVar30 = pSVar20->pPrior;
        } while (pSVar20->pPrior != (Select *)0x0);
      }
      uVar12 = 0;
      sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
      if (pSVar20 != (Select *)0x0) {
        do {
          selectInnerLoop(pParse,pSVar20,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&local_d8,1,1);
          if (pEVar22 != (Expr *)0x0) break;
          pSVar20->nSelectRow = sVar35;
          pSVar20 = pSVar20->pNext;
        } while (pSVar20 != (Select *)0x0);
        uVar12 = 0;
      }
    }
LAB_0018a83d:
    if (!bVar41) goto LAB_0018a84a;
    pSVar20 = (Select *)0x0;
  }
LAB_0018bf37:
  pDest->iSdst = local_d8.iSdst;
  pDest->nSdst = local_d8.nSdst;
  if (pSVar20 != (Select *)0x0) {
    sqlite3ParserAddCleanup(pParse,sqlite3SelectDeleteGeneric,pSVar20);
  }
LAB_0018bf5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar12;
  }
  __stack_chk_fail();
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  assert( p->selFlags & SF_Compound );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  assert( pPrior->pOrderBy==0 );
  assert( pPrior->pLimit==0 );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    if( rc>=0 ) goto multi_select_end;
    rc = SQLITE_OK;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( (p->selFlags & SF_Recursive)!=0 && hasAnchor(p) ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit = 0;  /* Initialize to suppress harmless compiler warning */
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL left...\n"));
        rc = sqlite3Select(pParse, pPrior, &dest);
        pPrior->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL right...\n"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( p->pLimit
         && sqlite3ExprIsInteger(p->pLimit->pLeft, &nLimit, pParse)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit)
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;

        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }


        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION left...\n"));
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION right...\n"));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        assert( p->pOrderBy==0 );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;

        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        assert( p->pEList || db->mallocFailed );
        if( dest.eDest!=priorOp && db->mallocFailed==0 ){
          int iCont, iBreak, iStart;
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;

        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );

        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );

        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT left...\n"));
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT right...\n"));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;

        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        if( rc ) break;
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }

  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  if( pParse->nErr ) goto multi_select_end;

  /* Compute collating sequences used by
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    assert( p->pEList!=0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if( pDelete ){
    sqlite3ParserAddCleanup(pParse, sqlite3SelectDeleteGeneric, pDelete);
  }
  return rc;
}